

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O2

void __thiscall caffe::LayerParameter::MergeFrom(LayerParameter *this,LayerParameter *from)

{
  uint32 *puVar1;
  uint uVar2;
  void *pvVar3;
  LogMessage *other;
  TransformationParameter *this_00;
  LossParameter *this_01;
  AccuracyParameter *this_02;
  ArgMaxParameter *this_03;
  ConcatParameter *this_04;
  ContrastiveLossParameter *this_05;
  ConvolutionParameter *this_06;
  DataParameter *this_07;
  DropoutParameter *this_08;
  DummyDataParameter *this_09;
  EltwiseParameter *this_10;
  ExpParameter *this_11;
  HDF5DataParameter *this_12;
  HDF5OutputParameter *this_13;
  HingeLossParameter *this_14;
  ImageDataParameter *this_15;
  InfogainLossParameter *this_16;
  InnerProductParameter *this_17;
  LRNParameter *this_18;
  MemoryDataParameter *this_19;
  MVNParameter *this_20;
  PoolingParameter *this_21;
  PowerParameter *this_22;
  ReLUParameter *this_23;
  SigmoidParameter *this_24;
  SoftmaxParameter *this_25;
  SliceParameter *this_26;
  TanHParameter *this_27;
  ThresholdParameter *this_28;
  WindowDataParameter *this_29;
  PythonParameter *this_30;
  PReLUParameter *this_31;
  SPPParameter *this_32;
  ReshapeParameter *this_33;
  LogParameter *this_34;
  FlattenParameter *this_35;
  ReductionParameter *this_36;
  EmbedParameter *this_37;
  TileParameter *this_38;
  BatchNormParameter *this_39;
  ELUParameter *this_40;
  BiasParameter *this_41;
  ScaleParameter *this_42;
  InputParameter *this_43;
  CropParameter *this_44;
  ParameterParameter *this_45;
  RecurrentParameter *this_46;
  TransformationParameter *from_00;
  LossParameter *from_01;
  AccuracyParameter *from_02;
  ArgMaxParameter *from_03;
  ConcatParameter *from_04;
  ContrastiveLossParameter *from_05;
  ConvolutionParameter *from_06;
  DataParameter *from_07;
  DropoutParameter *from_08;
  DummyDataParameter *from_09;
  EltwiseParameter *from_10;
  ExpParameter *from_11;
  HDF5DataParameter *from_12;
  HDF5OutputParameter *from_13;
  HingeLossParameter *from_14;
  ImageDataParameter *from_15;
  InfogainLossParameter *from_16;
  InnerProductParameter *from_17;
  LRNParameter *from_18;
  MemoryDataParameter *from_19;
  MVNParameter *from_20;
  PoolingParameter *from_21;
  PowerParameter *from_22;
  ReLUParameter *from_23;
  SigmoidParameter *from_24;
  SoftmaxParameter *from_25;
  SliceParameter *from_26;
  TanHParameter *from_27;
  ThresholdParameter *from_28;
  WindowDataParameter *from_29;
  PythonParameter *from_30;
  PReLUParameter *from_31;
  SPPParameter *from_32;
  ReshapeParameter *from_33;
  LogParameter *from_34;
  FlattenParameter *from_35;
  ReductionParameter *from_36;
  EmbedParameter *from_37;
  TileParameter *from_38;
  BatchNormParameter *from_39;
  ELUParameter *from_40;
  BiasParameter *from_41;
  ScaleParameter *from_42;
  InputParameter *from_43;
  CropParameter *from_44;
  ParameterParameter *from_45;
  RecurrentParameter *from_46;
  LogFinisher local_59;
  LogMessage local_58;
  
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
               ,0x3ad1);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_58,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_59,other);
    google::protobuf::internal::LogMessage::~LogMessage(&local_58);
  }
  pvVar3 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar3 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArena::DoMergeFrom
              (&this->_internal_metadata_,(UnknownFieldSet *)((ulong)pvVar3 & 0xfffffffffffffffe));
  }
  google::protobuf::internal::RepeatedPtrFieldBase::
  MergeFrom<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
            (&(this->bottom_).super_RepeatedPtrFieldBase,&(from->bottom_).super_RepeatedPtrFieldBase
            );
  google::protobuf::internal::RepeatedPtrFieldBase::
  MergeFrom<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
            (&(this->top_).super_RepeatedPtrFieldBase,&(from->top_).super_RepeatedPtrFieldBase);
  google::protobuf::RepeatedField<float>::MergeFrom(&this->loss_weight_,&from->loss_weight_);
  google::protobuf::internal::RepeatedPtrFieldBase::
  MergeFrom<google::protobuf::RepeatedPtrField<caffe::ParamSpec>::TypeHandler>
            (&(this->param_).super_RepeatedPtrFieldBase,&(from->param_).super_RepeatedPtrFieldBase);
  google::protobuf::internal::RepeatedPtrFieldBase::
  MergeFrom<google::protobuf::RepeatedPtrField<caffe::BlobProto>::TypeHandler>
            (&(this->blobs_).super_RepeatedPtrFieldBase,&(from->blobs_).super_RepeatedPtrFieldBase);
  google::protobuf::internal::RepeatedPtrFieldBase::
  MergeFrom<google::protobuf::RepeatedPtrField<caffe::NetStateRule>::TypeHandler>
            (&(this->include_).super_RepeatedPtrFieldBase,
             &(from->include_).super_RepeatedPtrFieldBase);
  google::protobuf::internal::RepeatedPtrFieldBase::
  MergeFrom<google::protobuf::RepeatedPtrField<caffe::NetStateRule>::TypeHandler>
            (&(this->exclude_).super_RepeatedPtrFieldBase,
             &(from->exclude_).super_RepeatedPtrFieldBase);
  google::protobuf::RepeatedField<bool>::MergeFrom(&this->propagate_down_,&from->propagate_down_);
  uVar2 = (from->_has_bits_).has_bits_[0];
  if ((char)uVar2 != '\0') {
    if ((uVar2 & 1) != 0) {
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 1;
      google::protobuf::internal::ArenaStringPtr::AssignWithDefault
                (&this->name_,
                 (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
                 (from->name_).ptr_);
    }
    if ((uVar2 & 2) != 0) {
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 2;
      google::protobuf::internal::ArenaStringPtr::AssignWithDefault
                (&this->type_,
                 (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
                 (from->type_).ptr_);
    }
    if ((uVar2 & 4) != 0) {
      this_00 = mutable_transform_param(this);
      from_00 = from->transform_param_;
      if (from_00 == (TransformationParameter *)0x0) {
        from_00 = (TransformationParameter *)&_TransformationParameter_default_instance_;
      }
      TransformationParameter::MergeFrom(this_00,from_00);
    }
    if ((uVar2 & 8) != 0) {
      this_01 = mutable_loss_param(this);
      from_01 = from->loss_param_;
      if (from_01 == (LossParameter *)0x0) {
        from_01 = (LossParameter *)&_LossParameter_default_instance_;
      }
      LossParameter::MergeFrom(this_01,from_01);
    }
    if ((uVar2 & 0x10) != 0) {
      this_02 = mutable_accuracy_param(this);
      from_02 = from->accuracy_param_;
      if (from_02 == (AccuracyParameter *)0x0) {
        from_02 = (AccuracyParameter *)&_AccuracyParameter_default_instance_;
      }
      AccuracyParameter::MergeFrom(this_02,from_02);
    }
    if ((uVar2 & 0x20) != 0) {
      this_03 = mutable_argmax_param(this);
      from_03 = from->argmax_param_;
      if (from_03 == (ArgMaxParameter *)0x0) {
        from_03 = (ArgMaxParameter *)&_ArgMaxParameter_default_instance_;
      }
      ArgMaxParameter::MergeFrom(this_03,from_03);
    }
    if ((uVar2 & 0x40) != 0) {
      this_04 = mutable_concat_param(this);
      from_04 = from->concat_param_;
      if (from_04 == (ConcatParameter *)0x0) {
        from_04 = (ConcatParameter *)&_ConcatParameter_default_instance_;
      }
      ConcatParameter::MergeFrom(this_04,from_04);
    }
    if ((char)uVar2 < '\0') {
      this_05 = mutable_contrastive_loss_param(this);
      from_05 = from->contrastive_loss_param_;
      if (from_05 == (ContrastiveLossParameter *)0x0) {
        from_05 = (ContrastiveLossParameter *)&_ContrastiveLossParameter_default_instance_;
      }
      ContrastiveLossParameter::MergeFrom(this_05,from_05);
    }
  }
  if ((uVar2 & 0xff00) != 0) {
    if ((uVar2 >> 8 & 1) != 0) {
      this_06 = mutable_convolution_param(this);
      from_06 = from->convolution_param_;
      if (from_06 == (ConvolutionParameter *)0x0) {
        from_06 = (ConvolutionParameter *)&_ConvolutionParameter_default_instance_;
      }
      ConvolutionParameter::MergeFrom(this_06,from_06);
    }
    if ((uVar2 >> 9 & 1) != 0) {
      this_07 = mutable_data_param(this);
      from_07 = from->data_param_;
      if (from_07 == (DataParameter *)0x0) {
        from_07 = (DataParameter *)&_DataParameter_default_instance_;
      }
      DataParameter::MergeFrom(this_07,from_07);
    }
    if ((uVar2 >> 10 & 1) != 0) {
      this_08 = mutable_dropout_param(this);
      from_08 = from->dropout_param_;
      if (from_08 == (DropoutParameter *)0x0) {
        from_08 = (DropoutParameter *)&_DropoutParameter_default_instance_;
      }
      DropoutParameter::MergeFrom(this_08,from_08);
    }
    if ((uVar2 >> 0xb & 1) != 0) {
      this_09 = mutable_dummy_data_param(this);
      from_09 = from->dummy_data_param_;
      if (from_09 == (DummyDataParameter *)0x0) {
        from_09 = (DummyDataParameter *)&_DummyDataParameter_default_instance_;
      }
      DummyDataParameter::MergeFrom(this_09,from_09);
    }
    if ((uVar2 >> 0xc & 1) != 0) {
      this_10 = mutable_eltwise_param(this);
      from_10 = from->eltwise_param_;
      if (from_10 == (EltwiseParameter *)0x0) {
        from_10 = (EltwiseParameter *)&_EltwiseParameter_default_instance_;
      }
      EltwiseParameter::MergeFrom(this_10,from_10);
    }
    if ((uVar2 >> 0xd & 1) != 0) {
      this_11 = mutable_exp_param(this);
      from_11 = from->exp_param_;
      if (from_11 == (ExpParameter *)0x0) {
        from_11 = (ExpParameter *)&_ExpParameter_default_instance_;
      }
      ExpParameter::MergeFrom(this_11,from_11);
    }
    if ((uVar2 >> 0xe & 1) != 0) {
      this_12 = mutable_hdf5_data_param(this);
      from_12 = from->hdf5_data_param_;
      if (from_12 == (HDF5DataParameter *)0x0) {
        from_12 = (HDF5DataParameter *)&_HDF5DataParameter_default_instance_;
      }
      HDF5DataParameter::MergeFrom(this_12,from_12);
    }
    if ((short)uVar2 < 0) {
      this_13 = mutable_hdf5_output_param(this);
      from_13 = from->hdf5_output_param_;
      if (from_13 == (HDF5OutputParameter *)0x0) {
        from_13 = (HDF5OutputParameter *)&_HDF5OutputParameter_default_instance_;
      }
      HDF5OutputParameter::MergeFrom(this_13,from_13);
    }
  }
  if ((uVar2 & 0xff0000) != 0) {
    if ((uVar2 >> 0x10 & 1) != 0) {
      this_14 = mutable_hinge_loss_param(this);
      from_14 = from->hinge_loss_param_;
      if (from_14 == (HingeLossParameter *)0x0) {
        from_14 = (HingeLossParameter *)&_HingeLossParameter_default_instance_;
      }
      HingeLossParameter::MergeFrom(this_14,from_14);
    }
    if ((uVar2 >> 0x11 & 1) != 0) {
      this_15 = mutable_image_data_param(this);
      from_15 = from->image_data_param_;
      if (from_15 == (ImageDataParameter *)0x0) {
        from_15 = (ImageDataParameter *)&_ImageDataParameter_default_instance_;
      }
      ImageDataParameter::MergeFrom(this_15,from_15);
    }
    if ((uVar2 >> 0x12 & 1) != 0) {
      this_16 = mutable_infogain_loss_param(this);
      from_16 = from->infogain_loss_param_;
      if (from_16 == (InfogainLossParameter *)0x0) {
        from_16 = (InfogainLossParameter *)&_InfogainLossParameter_default_instance_;
      }
      InfogainLossParameter::MergeFrom(this_16,from_16);
    }
    if ((uVar2 >> 0x13 & 1) != 0) {
      this_17 = mutable_inner_product_param(this);
      from_17 = from->inner_product_param_;
      if (from_17 == (InnerProductParameter *)0x0) {
        from_17 = (InnerProductParameter *)&_InnerProductParameter_default_instance_;
      }
      InnerProductParameter::MergeFrom(this_17,from_17);
    }
    if ((uVar2 >> 0x14 & 1) != 0) {
      this_18 = mutable_lrn_param(this);
      from_18 = from->lrn_param_;
      if (from_18 == (LRNParameter *)0x0) {
        from_18 = (LRNParameter *)&_LRNParameter_default_instance_;
      }
      LRNParameter::MergeFrom(this_18,from_18);
    }
    if ((uVar2 >> 0x15 & 1) != 0) {
      this_19 = mutable_memory_data_param(this);
      from_19 = from->memory_data_param_;
      if (from_19 == (MemoryDataParameter *)0x0) {
        from_19 = (MemoryDataParameter *)&_MemoryDataParameter_default_instance_;
      }
      MemoryDataParameter::MergeFrom(this_19,from_19);
    }
    if ((uVar2 >> 0x16 & 1) != 0) {
      this_20 = mutable_mvn_param(this);
      from_20 = from->mvn_param_;
      if (from_20 == (MVNParameter *)0x0) {
        from_20 = (MVNParameter *)&_MVNParameter_default_instance_;
      }
      MVNParameter::MergeFrom(this_20,from_20);
    }
    if ((uVar2 >> 0x17 & 1) != 0) {
      this_21 = mutable_pooling_param(this);
      from_21 = from->pooling_param_;
      if (from_21 == (PoolingParameter *)0x0) {
        from_21 = (PoolingParameter *)&_PoolingParameter_default_instance_;
      }
      PoolingParameter::MergeFrom(this_21,from_21);
    }
  }
  if (0xffffff < uVar2) {
    if ((uVar2 >> 0x18 & 1) != 0) {
      this_22 = mutable_power_param(this);
      from_22 = from->power_param_;
      if (from_22 == (PowerParameter *)0x0) {
        from_22 = (PowerParameter *)&_PowerParameter_default_instance_;
      }
      PowerParameter::MergeFrom(this_22,from_22);
    }
    if ((uVar2 >> 0x19 & 1) != 0) {
      this_23 = mutable_relu_param(this);
      from_23 = from->relu_param_;
      if (from_23 == (ReLUParameter *)0x0) {
        from_23 = (ReLUParameter *)&_ReLUParameter_default_instance_;
      }
      ReLUParameter::MergeFrom(this_23,from_23);
    }
    if ((uVar2 >> 0x1a & 1) != 0) {
      this_24 = mutable_sigmoid_param(this);
      from_24 = from->sigmoid_param_;
      if (from_24 == (SigmoidParameter *)0x0) {
        from_24 = (SigmoidParameter *)&_SigmoidParameter_default_instance_;
      }
      SigmoidParameter::MergeFrom(this_24,from_24);
    }
    if ((uVar2 >> 0x1b & 1) != 0) {
      this_25 = mutable_softmax_param(this);
      from_25 = from->softmax_param_;
      if (from_25 == (SoftmaxParameter *)0x0) {
        from_25 = (SoftmaxParameter *)&_SoftmaxParameter_default_instance_;
      }
      SoftmaxParameter::MergeFrom(this_25,from_25);
    }
    if ((uVar2 >> 0x1c & 1) != 0) {
      this_26 = mutable_slice_param(this);
      from_26 = from->slice_param_;
      if (from_26 == (SliceParameter *)0x0) {
        from_26 = (SliceParameter *)&_SliceParameter_default_instance_;
      }
      SliceParameter::MergeFrom(this_26,from_26);
    }
    if ((uVar2 >> 0x1d & 1) != 0) {
      this_27 = mutable_tanh_param(this);
      from_27 = from->tanh_param_;
      if (from_27 == (TanHParameter *)0x0) {
        from_27 = (TanHParameter *)&_TanHParameter_default_instance_;
      }
      TanHParameter::MergeFrom(this_27,from_27);
    }
    if ((uVar2 >> 0x1e & 1) != 0) {
      this_28 = mutable_threshold_param(this);
      from_28 = from->threshold_param_;
      if (from_28 == (ThresholdParameter *)0x0) {
        from_28 = (ThresholdParameter *)&_ThresholdParameter_default_instance_;
      }
      ThresholdParameter::MergeFrom(this_28,from_28);
    }
    if ((int)uVar2 < 0) {
      this_29 = mutable_window_data_param(this);
      from_29 = from->window_data_param_;
      if (from_29 == (WindowDataParameter *)0x0) {
        from_29 = (WindowDataParameter *)&_WindowDataParameter_default_instance_;
      }
      WindowDataParameter::MergeFrom(this_29,from_29);
    }
  }
  uVar2 = (from->_has_bits_).has_bits_[1];
  if ((char)uVar2 != '\0') {
    if ((uVar2 & 1) != 0) {
      this_30 = mutable_python_param(this);
      from_30 = from->python_param_;
      if (from_30 == (PythonParameter *)0x0) {
        from_30 = (PythonParameter *)&_PythonParameter_default_instance_;
      }
      PythonParameter::MergeFrom(this_30,from_30);
    }
    if ((uVar2 & 2) != 0) {
      this_31 = mutable_prelu_param(this);
      from_31 = from->prelu_param_;
      if (from_31 == (PReLUParameter *)0x0) {
        from_31 = (PReLUParameter *)&_PReLUParameter_default_instance_;
      }
      PReLUParameter::MergeFrom(this_31,from_31);
    }
    if ((uVar2 & 4) != 0) {
      this_32 = mutable_spp_param(this);
      from_32 = from->spp_param_;
      if (from_32 == (SPPParameter *)0x0) {
        from_32 = (SPPParameter *)&_SPPParameter_default_instance_;
      }
      SPPParameter::MergeFrom(this_32,from_32);
    }
    if ((uVar2 & 8) != 0) {
      this_33 = mutable_reshape_param(this);
      from_33 = from->reshape_param_;
      if (from_33 == (ReshapeParameter *)0x0) {
        from_33 = (ReshapeParameter *)&_ReshapeParameter_default_instance_;
      }
      ReshapeParameter::MergeFrom(this_33,from_33);
    }
    if ((uVar2 & 0x10) != 0) {
      this_34 = mutable_log_param(this);
      from_34 = from->log_param_;
      if (from_34 == (LogParameter *)0x0) {
        from_34 = (LogParameter *)&_LogParameter_default_instance_;
      }
      LogParameter::MergeFrom(this_34,from_34);
    }
    if ((uVar2 & 0x20) != 0) {
      this_35 = mutable_flatten_param(this);
      from_35 = from->flatten_param_;
      if (from_35 == (FlattenParameter *)0x0) {
        from_35 = (FlattenParameter *)&_FlattenParameter_default_instance_;
      }
      FlattenParameter::MergeFrom(this_35,from_35);
    }
    if ((uVar2 & 0x40) != 0) {
      this_36 = mutable_reduction_param(this);
      from_36 = from->reduction_param_;
      if (from_36 == (ReductionParameter *)0x0) {
        from_36 = (ReductionParameter *)&_ReductionParameter_default_instance_;
      }
      ReductionParameter::MergeFrom(this_36,from_36);
    }
    if ((char)uVar2 < '\0') {
      this_37 = mutable_embed_param(this);
      from_37 = from->embed_param_;
      if (from_37 == (EmbedParameter *)0x0) {
        from_37 = (EmbedParameter *)&_EmbedParameter_default_instance_;
      }
      EmbedParameter::MergeFrom(this_37,from_37);
    }
  }
  if ((uVar2 & 0xff00) != 0) {
    if ((uVar2 >> 8 & 1) != 0) {
      this_38 = mutable_tile_param(this);
      from_38 = from->tile_param_;
      if (from_38 == (TileParameter *)0x0) {
        from_38 = (TileParameter *)&_TileParameter_default_instance_;
      }
      TileParameter::MergeFrom(this_38,from_38);
    }
    if ((uVar2 >> 9 & 1) != 0) {
      this_39 = mutable_batch_norm_param(this);
      from_39 = from->batch_norm_param_;
      if (from_39 == (BatchNormParameter *)0x0) {
        from_39 = (BatchNormParameter *)&_BatchNormParameter_default_instance_;
      }
      BatchNormParameter::MergeFrom(this_39,from_39);
    }
    if ((uVar2 >> 10 & 1) != 0) {
      this_40 = mutable_elu_param(this);
      from_40 = from->elu_param_;
      if (from_40 == (ELUParameter *)0x0) {
        from_40 = (ELUParameter *)&_ELUParameter_default_instance_;
      }
      ELUParameter::MergeFrom(this_40,from_40);
    }
    if ((uVar2 >> 0xb & 1) != 0) {
      this_41 = mutable_bias_param(this);
      from_41 = from->bias_param_;
      if (from_41 == (BiasParameter *)0x0) {
        from_41 = (BiasParameter *)&_BiasParameter_default_instance_;
      }
      BiasParameter::MergeFrom(this_41,from_41);
    }
    if ((uVar2 >> 0xc & 1) != 0) {
      this_42 = mutable_scale_param(this);
      from_42 = from->scale_param_;
      if (from_42 == (ScaleParameter *)0x0) {
        from_42 = (ScaleParameter *)&_ScaleParameter_default_instance_;
      }
      ScaleParameter::MergeFrom(this_42,from_42);
    }
    if ((uVar2 >> 0xd & 1) != 0) {
      this_43 = mutable_input_param(this);
      from_43 = from->input_param_;
      if (from_43 == (InputParameter *)0x0) {
        from_43 = (InputParameter *)&_InputParameter_default_instance_;
      }
      InputParameter::MergeFrom(this_43,from_43);
    }
    if ((uVar2 >> 0xe & 1) != 0) {
      this_44 = mutable_crop_param(this);
      from_44 = from->crop_param_;
      if (from_44 == (CropParameter *)0x0) {
        from_44 = (CropParameter *)&_CropParameter_default_instance_;
      }
      CropParameter::MergeFrom(this_44,from_44);
    }
    if ((short)uVar2 < 0) {
      this_45 = mutable_parameter_param(this);
      from_45 = from->parameter_param_;
      if (from_45 == (ParameterParameter *)0x0) {
        from_45 = (ParameterParameter *)&_ParameterParameter_default_instance_;
      }
      ParameterParameter::MergeFrom(this_45,from_45);
    }
  }
  if ((uVar2 & 0x30000) != 0) {
    if ((uVar2 >> 0x10 & 1) != 0) {
      this_46 = mutable_recurrent_param(this);
      from_46 = from->recurrent_param_;
      if (from_46 == (RecurrentParameter *)0x0) {
        from_46 = (RecurrentParameter *)&_RecurrentParameter_default_instance_;
      }
      RecurrentParameter::MergeFrom(this_46,from_46);
    }
    if ((uVar2 >> 0x11 & 1) != 0) {
      this->phase_ = from->phase_;
    }
    puVar1 = (this->_has_bits_).has_bits_ + 1;
    *puVar1 = *puVar1 | uVar2;
  }
  return;
}

Assistant:

void LayerParameter::MergeFrom(const LayerParameter& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:caffe.LayerParameter)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  bottom_.MergeFrom(from.bottom_);
  top_.MergeFrom(from.top_);
  loss_weight_.MergeFrom(from.loss_weight_);
  param_.MergeFrom(from.param_);
  blobs_.MergeFrom(from.blobs_);
  include_.MergeFrom(from.include_);
  exclude_.MergeFrom(from.exclude_);
  propagate_down_.MergeFrom(from.propagate_down_);
  cached_has_bits = from._has_bits_[0];
  if (cached_has_bits & 255u) {
    if (cached_has_bits & 0x00000001u) {
      set_has_name();
      name_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.name_);
    }
    if (cached_has_bits & 0x00000002u) {
      set_has_type();
      type_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.type_);
    }
    if (cached_has_bits & 0x00000004u) {
      mutable_transform_param()->::caffe::TransformationParameter::MergeFrom(from.transform_param());
    }
    if (cached_has_bits & 0x00000008u) {
      mutable_loss_param()->::caffe::LossParameter::MergeFrom(from.loss_param());
    }
    if (cached_has_bits & 0x00000010u) {
      mutable_accuracy_param()->::caffe::AccuracyParameter::MergeFrom(from.accuracy_param());
    }
    if (cached_has_bits & 0x00000020u) {
      mutable_argmax_param()->::caffe::ArgMaxParameter::MergeFrom(from.argmax_param());
    }
    if (cached_has_bits & 0x00000040u) {
      mutable_concat_param()->::caffe::ConcatParameter::MergeFrom(from.concat_param());
    }
    if (cached_has_bits & 0x00000080u) {
      mutable_contrastive_loss_param()->::caffe::ContrastiveLossParameter::MergeFrom(from.contrastive_loss_param());
    }
  }
  if (cached_has_bits & 65280u) {
    if (cached_has_bits & 0x00000100u) {
      mutable_convolution_param()->::caffe::ConvolutionParameter::MergeFrom(from.convolution_param());
    }
    if (cached_has_bits & 0x00000200u) {
      mutable_data_param()->::caffe::DataParameter::MergeFrom(from.data_param());
    }
    if (cached_has_bits & 0x00000400u) {
      mutable_dropout_param()->::caffe::DropoutParameter::MergeFrom(from.dropout_param());
    }
    if (cached_has_bits & 0x00000800u) {
      mutable_dummy_data_param()->::caffe::DummyDataParameter::MergeFrom(from.dummy_data_param());
    }
    if (cached_has_bits & 0x00001000u) {
      mutable_eltwise_param()->::caffe::EltwiseParameter::MergeFrom(from.eltwise_param());
    }
    if (cached_has_bits & 0x00002000u) {
      mutable_exp_param()->::caffe::ExpParameter::MergeFrom(from.exp_param());
    }
    if (cached_has_bits & 0x00004000u) {
      mutable_hdf5_data_param()->::caffe::HDF5DataParameter::MergeFrom(from.hdf5_data_param());
    }
    if (cached_has_bits & 0x00008000u) {
      mutable_hdf5_output_param()->::caffe::HDF5OutputParameter::MergeFrom(from.hdf5_output_param());
    }
  }
  if (cached_has_bits & 16711680u) {
    if (cached_has_bits & 0x00010000u) {
      mutable_hinge_loss_param()->::caffe::HingeLossParameter::MergeFrom(from.hinge_loss_param());
    }
    if (cached_has_bits & 0x00020000u) {
      mutable_image_data_param()->::caffe::ImageDataParameter::MergeFrom(from.image_data_param());
    }
    if (cached_has_bits & 0x00040000u) {
      mutable_infogain_loss_param()->::caffe::InfogainLossParameter::MergeFrom(from.infogain_loss_param());
    }
    if (cached_has_bits & 0x00080000u) {
      mutable_inner_product_param()->::caffe::InnerProductParameter::MergeFrom(from.inner_product_param());
    }
    if (cached_has_bits & 0x00100000u) {
      mutable_lrn_param()->::caffe::LRNParameter::MergeFrom(from.lrn_param());
    }
    if (cached_has_bits & 0x00200000u) {
      mutable_memory_data_param()->::caffe::MemoryDataParameter::MergeFrom(from.memory_data_param());
    }
    if (cached_has_bits & 0x00400000u) {
      mutable_mvn_param()->::caffe::MVNParameter::MergeFrom(from.mvn_param());
    }
    if (cached_has_bits & 0x00800000u) {
      mutable_pooling_param()->::caffe::PoolingParameter::MergeFrom(from.pooling_param());
    }
  }
  if (cached_has_bits & 4278190080u) {
    if (cached_has_bits & 0x01000000u) {
      mutable_power_param()->::caffe::PowerParameter::MergeFrom(from.power_param());
    }
    if (cached_has_bits & 0x02000000u) {
      mutable_relu_param()->::caffe::ReLUParameter::MergeFrom(from.relu_param());
    }
    if (cached_has_bits & 0x04000000u) {
      mutable_sigmoid_param()->::caffe::SigmoidParameter::MergeFrom(from.sigmoid_param());
    }
    if (cached_has_bits & 0x08000000u) {
      mutable_softmax_param()->::caffe::SoftmaxParameter::MergeFrom(from.softmax_param());
    }
    if (cached_has_bits & 0x10000000u) {
      mutable_slice_param()->::caffe::SliceParameter::MergeFrom(from.slice_param());
    }
    if (cached_has_bits & 0x20000000u) {
      mutable_tanh_param()->::caffe::TanHParameter::MergeFrom(from.tanh_param());
    }
    if (cached_has_bits & 0x40000000u) {
      mutable_threshold_param()->::caffe::ThresholdParameter::MergeFrom(from.threshold_param());
    }
    if (cached_has_bits & 0x80000000u) {
      mutable_window_data_param()->::caffe::WindowDataParameter::MergeFrom(from.window_data_param());
    }
  }
  cached_has_bits = from._has_bits_[1];
  if (cached_has_bits & 255u) {
    if (cached_has_bits & 0x00000001u) {
      mutable_python_param()->::caffe::PythonParameter::MergeFrom(from.python_param());
    }
    if (cached_has_bits & 0x00000002u) {
      mutable_prelu_param()->::caffe::PReLUParameter::MergeFrom(from.prelu_param());
    }
    if (cached_has_bits & 0x00000004u) {
      mutable_spp_param()->::caffe::SPPParameter::MergeFrom(from.spp_param());
    }
    if (cached_has_bits & 0x00000008u) {
      mutable_reshape_param()->::caffe::ReshapeParameter::MergeFrom(from.reshape_param());
    }
    if (cached_has_bits & 0x00000010u) {
      mutable_log_param()->::caffe::LogParameter::MergeFrom(from.log_param());
    }
    if (cached_has_bits & 0x00000020u) {
      mutable_flatten_param()->::caffe::FlattenParameter::MergeFrom(from.flatten_param());
    }
    if (cached_has_bits & 0x00000040u) {
      mutable_reduction_param()->::caffe::ReductionParameter::MergeFrom(from.reduction_param());
    }
    if (cached_has_bits & 0x00000080u) {
      mutable_embed_param()->::caffe::EmbedParameter::MergeFrom(from.embed_param());
    }
  }
  if (cached_has_bits & 65280u) {
    if (cached_has_bits & 0x00000100u) {
      mutable_tile_param()->::caffe::TileParameter::MergeFrom(from.tile_param());
    }
    if (cached_has_bits & 0x00000200u) {
      mutable_batch_norm_param()->::caffe::BatchNormParameter::MergeFrom(from.batch_norm_param());
    }
    if (cached_has_bits & 0x00000400u) {
      mutable_elu_param()->::caffe::ELUParameter::MergeFrom(from.elu_param());
    }
    if (cached_has_bits & 0x00000800u) {
      mutable_bias_param()->::caffe::BiasParameter::MergeFrom(from.bias_param());
    }
    if (cached_has_bits & 0x00001000u) {
      mutable_scale_param()->::caffe::ScaleParameter::MergeFrom(from.scale_param());
    }
    if (cached_has_bits & 0x00002000u) {
      mutable_input_param()->::caffe::InputParameter::MergeFrom(from.input_param());
    }
    if (cached_has_bits & 0x00004000u) {
      mutable_crop_param()->::caffe::CropParameter::MergeFrom(from.crop_param());
    }
    if (cached_has_bits & 0x00008000u) {
      mutable_parameter_param()->::caffe::ParameterParameter::MergeFrom(from.parameter_param());
    }
  }
  if (cached_has_bits & 196608u) {
    if (cached_has_bits & 0x00010000u) {
      mutable_recurrent_param()->::caffe::RecurrentParameter::MergeFrom(from.recurrent_param());
    }
    if (cached_has_bits & 0x00020000u) {
      phase_ = from.phase_;
    }
    _has_bits_[1] |= cached_has_bits;
  }
}